

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota_lessor.c
# Opt level: O3

void test_hard_lease(void)

{
  bool bVar1;
  ulong uVar2;
  uint64_t __e;
  uint uVar3;
  int condition;
  size_t available;
  ulong uVar4;
  uint local_38;
  quota q;
  
  plan(0xc);
  _space(_stdout);
  printf("# *** %s ***\n","test_hard_lease");
  LOCK();
  UNLOCK();
  _ok(1,"QUOTA_USE_MIN == quota_lease(&l, QUOTA_USE_MIN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x49
      ,"lease 1Mb");
  _ok(1,"0 == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4a
      ,"available 0");
  _ok(1,"QUOTA_USE_MIN == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4b
      ,"leased 1Mb");
  _ok(1,"QUOTA_USE_MIN == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4c
      ,"source quota used");
  local_38 = 0x400;
  uVar4 = 0x100000;
  _ok(1,"-1 == quota_lease(&l, QUOTA_USE_MIN)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x4e
      ,"lease too big");
  uVar2 = 0x100000;
  do {
    uVar3 = (int)(uVar2 + 0x3ff >> 10) + 0x400;
    if (uVar3 < 0x401) {
      __assert_fail("new_used_in_units > used_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0x90,"ssize_t quota_use(struct quota *, size_t)");
    }
    if (uVar3 < 0x481) {
      LOCK();
      UNLOCK();
      uVar4 = (ulong)((uint)(uVar2 + 0x3ff) & 0x3ffc00) + 0x100000;
      condition = 1;
      uVar2 = 0x100400;
      local_38 = uVar3;
      goto LAB_00101dda;
    }
    bVar1 = 0x7ff < uVar2;
    uVar2 = uVar2 >> 1;
  } while (bVar1);
  condition = 0;
  uVar2 = uVar4;
LAB_00101dda:
  _ok(condition,"QUOTA_UNIT_SIZE == quota_lease(&l, QUOTA_UNIT_SIZE)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x50
      ,"hard lease");
  _ok((uint)(uVar2 == 0x100400),"QUOTA_UNIT_SIZE + QUOTA_USE_MIN == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x52
      ,"leased changed");
  _ok((uint)(uVar4 - uVar2 == 0x1fc00),"QUOTA_USE_MIN / 8 - QUOTA_UNIT_SIZE == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x54
      ,"available the part of 1MB");
  _ok((uint)(local_38 == 0x480),"quota_total == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x55
      ,"source quota fully used");
  if (0x1fffff < uVar4) {
    if (0x3fffffffbff < uVar4 - 0x100400) goto LAB_00102004;
    uVar3 = (uint)(uVar4 - 0x100001 >> 10);
    if (local_38 < uVar3) goto LAB_00101fe5;
    local_38 = local_38 - uVar3;
    LOCK();
    UNLOCK();
    uVar4 = uVar4 - (uVar4 - 0x100001 & 0x3fffffffc00);
  }
  if (uVar4 != 0) {
    if (0x3fffffffbff < uVar4) {
LAB_00102004:
      __assert_fail("size < QUOTA_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xa2,"ssize_t quota_release(struct quota *, size_t)");
    }
    uVar3 = (uint)(uVar4 >> 10);
    if (local_38 < uVar3) {
LAB_00101fe5:
      __assert_fail("size_in_units <= used_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xab,"ssize_t quota_release(struct quota *, size_t)");
    }
    local_38 = local_38 - uVar3;
    LOCK();
    UNLOCK();
  }
  _ok(1,"0 == quota_available(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5a
      ,"lessor is empty");
  _ok(1,"0 == quota_leased(&l)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5b
      ,"lessor is empty");
  _ok((uint)(local_38 == 0),"0 == quota_used(&q)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota_lessor.c",0x5c
      ,"sourcr quota is empty");
  _space(_stdout);
  printf("# *** %s: done ***\n","test_hard_lease");
  check_plan();
  return;
}

Assistant:

void
test_hard_lease()
{
	plan(12);
	header();

	struct quota q;
	size_t quota_total = QUOTA_USE_MIN + QUOTA_USE_MIN / 8;
	quota_init(&q, quota_total);
	struct quota_lessor l;
	quota_lessor_create(&l, &q);
	is(QUOTA_USE_MIN, quota_lease(&l, QUOTA_USE_MIN), "lease 1Mb");
	is(0, quota_available(&l), "available 0");
	is(QUOTA_USE_MIN, quota_leased(&l), "leased 1Mb");
	is(QUOTA_USE_MIN, quota_used(&q), "source quota used");

	is(-1, quota_lease(&l, QUOTA_USE_MIN), "lease too big");

	is(QUOTA_UNIT_SIZE, quota_lease(&l, QUOTA_UNIT_SIZE), "hard lease");

	is(QUOTA_UNIT_SIZE + QUOTA_USE_MIN, quota_leased(&l), "leased changed");
	is(QUOTA_USE_MIN / 8 - QUOTA_UNIT_SIZE, quota_available(&l),
	   "available the part of 1MB");
	is(quota_total, quota_used(&q), "source quota fully used");

	quota_end_lease(&l, quota_leased(&l));

	quota_lessor_destroy(&l);
	is(0, quota_available(&l), "lessor is empty");
	is(0, quota_leased(&l), "lessor is empty");
	is(0, quota_used(&q), "sourcr quota is empty");

	footer();
	check_plan();
}